

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::GetAccept
          (Error *__return_storage_ptr__,Message *this,ContentFormat *aAcceptFormat)

{
  uint32_t e;
  ContentFormat CVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_13a;
  v10 local_139;
  v10 *local_138;
  size_t local_130;
  string local_128;
  Error local_108;
  OptionValue *local_d0;
  OptionValue *option;
  ContentFormat *local_c0;
  ContentFormat *aAcceptFormat_local;
  Message *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  option._7_1_ = 0;
  local_c0 = aAcceptFormat;
  aAcceptFormat_local = (ContentFormat *)this;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  local_d0 = GetOption(this,kAccept);
  if (local_d0 == (OptionValue *)0x0) {
    GetAccept::anon_class_1_0_00000001::operator()(&local_13a);
    local_58 = &local_138;
    local_60 = &local_139;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_130 = bVar2.size_;
    local_138 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_128;
    local_78 = local_138;
    sStack_70 = local_130;
    local_50 = &local_78;
    local_88 = local_138;
    local_80 = local_130;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,local_88,fmt,args);
    Error::Error(&local_108,kNotFound,&local_128);
    Error::operator=(__return_storage_ptr__,&local_108);
    Error::~Error(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    e = OptionValue::GetUint32Value(local_d0);
    CVar1 = utils::from_underlying<ot::commissioner::coap::ContentFormat>(e);
    *local_c0 = CVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetAccept(ContentFormat &aAcceptFormat) const
{
    Error error;

    auto option = GetOption(OptionType::kAccept);
    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("cannot find valid CoAP Accept option"));
    aAcceptFormat = utils::from_underlying<ContentFormat>(option->GetUint32Value());

exit:
    return error;
}